

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O0

uint RDL_getSSSR(RDL_data *data,RDL_cycle ***ptr)

{
  uint uVar1;
  RDL_graph *pRVar2;
  char *pcVar3;
  uchar uVar4;
  uint uVar5;
  int iVar6;
  uint nof_rows;
  RDL_cycle **ppRVar7;
  uchar **rows;
  uchar **rows_00;
  uchar *empty_cycle_00;
  uchar *cycle;
  void *pvVar8;
  uchar *empty_cycle;
  uint compressedSize;
  uint oldBasisCyclesSize;
  uint currentBasisCyclesSize;
  uchar **prototypesForGaussian;
  uchar **basisCycles;
  uchar *currentCycle;
  uint local_68;
  uint edge;
  uint alloced;
  uint total_counter;
  RDL_graph *curr_graph;
  char *prototype;
  uint local_48;
  uint internal_index;
  uint bcc_index;
  uint currBond;
  uint added;
  uint size;
  RDL_cycle **result;
  uint urf;
  uint rcf;
  uint k;
  uint j;
  RDL_cycle ***ptr_local;
  RDL_data *data_local;
  
  result._4_4_ = 0;
  result._0_4_ = 0;
  empty_cycle._4_4_ = 0;
  if (data == (RDL_data *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"RDL_data is NULL!\n");
    ppRVar7 = (RDL_cycle **)malloc(8);
    *ptr = ppRVar7;
    data_local._4_4_ = 0xffffffff;
  }
  else if (data->nofURFs == 0) {
    ppRVar7 = (RDL_cycle **)malloc(8);
    *ptr = ppRVar7;
    data_local._4_4_ = 0;
  }
  else {
    edge = 0;
    if (data->graph->E < data->graph->V) {
      local_68 = 0x40;
    }
    else {
      local_68 = (data->graph->E - data->graph->V) + 1;
    }
    _added = malloc((ulong)local_68 << 3);
    for (local_48 = 0; local_48 < data->bccGraphs->nof_bcc; local_48 = local_48 + 1) {
      pRVar2 = data->bccGraphs->bcc_graphs[local_48];
      uVar5 = (pRVar2->E - pRVar2->V) + 1;
      rows = (uchar **)malloc((ulong)uVar5 << 3);
      rows_00 = (uchar **)malloc((ulong)data->nofURFsPerBCC[local_48] << 3);
      for (prototype._4_4_ = 0; prototype._4_4_ < data->nofURFsPerBCC[local_48];
          prototype._4_4_ = prototype._4_4_ + 1) {
        empty_cycle._4_4_ =
             RDL_bitset_compressed
                       (rows_00 + prototype._4_4_,
                        (*data->urfInfoPerBCC[local_48]->URFs[prototype._4_4_])->prototype,pRVar2->E
                       );
      }
      empty_cycle_00 = (uchar *)malloc((ulong)empty_cycle._4_4_);
      memset(empty_cycle_00,0,(ulong)empty_cycle._4_4_);
      bcc_index = 0;
      compressedSize = 0;
      for (prototype._4_4_ = 0; prototype._4_4_ < data->nofURFsPerBCC[local_48];
          prototype._4_4_ = prototype._4_4_ + 1) {
        cycle = (uchar *)malloc((ulong)empty_cycle._4_4_);
        memcpy(cycle,rows_00[prototype._4_4_],(ulong)empty_cycle._4_4_);
        for (urf = 0; urf < compressedSize; urf = urf + 1) {
          uVar4 = RDL_bitset_test(cycle,urf);
          if (uVar4 != '\0') {
            RDL_bitset_xor_inplace(cycle,rows[urf],empty_cycle._4_4_);
          }
        }
        iVar6 = RDL_bitset_empty(cycle,empty_cycle_00,empty_cycle._4_4_);
        if (iVar6 == 0) {
          rows[compressedSize] = cycle;
          nof_rows = compressedSize + 1;
          uVar4 = RDL_bitset_test(cycle,compressedSize);
          urf = compressedSize;
          if (uVar4 == '\0') {
            do {
              urf = urf + 1;
              if (pRVar2->E <= urf) goto LAB_00108aa5;
              uVar4 = RDL_bitset_test(cycle,urf);
            } while (uVar4 == '\0');
            RDL_swap_columns(rows,nof_rows,compressedSize,urf);
            RDL_swap_columns(rows_00,data->nofURFsPerBCC[local_48],compressedSize,urf);
          }
LAB_00108aa5:
          pcVar3 = (*data->urfInfoPerBCC[local_48]->URFs[prototype._4_4_])->prototype;
          if (local_68 <= edge) {
            local_68 = local_68 << 1;
            _added = realloc(_added,(ulong)local_68 << 3);
          }
          internal_index = 0;
          pvVar8 = malloc(0x18);
          *(void **)((long)_added + (ulong)edge * 8) = pvVar8;
          pvVar8 = malloc((ulong)(*data->urfInfoPerBCC[local_48]->URFs[prototype._4_4_])->weight <<
                          3);
          **(undefined8 **)((long)_added + (ulong)edge * 8) = pvVar8;
          *(uint *)(*(long *)((long)_added + (ulong)edge * 8) + 8) =
               (*data->urfInfoPerBCC[local_48]->URFs[prototype._4_4_])->weight;
          *(int *)(*(long *)((long)_added + (ulong)edge * 8) + 0xc) = (int)result;
          *(int *)(*(long *)((long)_added + (ulong)edge * 8) + 0x10) = result._4_4_;
          for (rcf = 0; rcf < pRVar2->E; rcf = rcf + 1) {
            if (pcVar3[rcf] == '\x01') {
              uVar1 = data->bccGraphs->edge_from_bcc_mapping[local_48][rcf];
              *(uint *)(**(long **)((long)_added + (ulong)edge * 8) + (ulong)internal_index * 8) =
                   *data->graph->edges[uVar1];
              *(uint *)(**(long **)((long)_added + (ulong)edge * 8) + 4 + (ulong)internal_index * 8)
                   = data->graph->edges[uVar1][1];
              internal_index = internal_index + 1;
            }
          }
          result._4_4_ = data->urfInfoPerBCC[local_48]->nofCFsPerURF[prototype._4_4_] + result._4_4_
          ;
          edge = edge + 1;
          bcc_index = bcc_index + 1;
          compressedSize = nof_rows;
          if (bcc_index == uVar5) break;
        }
        else {
          free(cycle);
        }
        result._0_4_ = (int)result + 1;
      }
      for (urf = 0; urf < compressedSize; urf = urf + 1) {
        free(rows[urf]);
      }
      free(rows);
      for (urf = 0; urf < data->nofURFsPerBCC[local_48]; urf = urf + 1) {
        free(rows_00[urf]);
      }
      free(rows_00);
      free(empty_cycle_00);
    }
    ppRVar7 = (RDL_cycle **)realloc(_added,(ulong)edge << 3);
    *ptr = ppRVar7;
    data_local._4_4_ = edge;
  }
  return data_local._4_4_;
}

Assistant:

unsigned RDL_getSSSR(const RDL_data *data, RDL_cycle ***ptr)
{
  unsigned j, k, rcf=0, urf=0;
  RDL_cycle **result;
  unsigned size, added, currBond;
  unsigned bcc_index, internal_index;
  char* prototype;
  const RDL_graph* curr_graph;
  unsigned total_counter, alloced;
  unsigned edge;
  unsigned char *currentCycle;
  unsigned char **basisCycles;
  unsigned char **prototypesForGaussian;
  unsigned currentBasisCyclesSize;
  unsigned oldBasisCyclesSize;
  unsigned compressedSize = 0;
  const unsigned char* empty_cycle;


  if (!data) {
    RDL_outputFunc(RDL_ERROR, "RDL_data is NULL!\n");
    (*ptr) = malloc(sizeof(**ptr));
    return RDL_INVALID_RESULT;
  }

  if (data->nofURFs < 1) {
    (*ptr) = malloc(sizeof(**ptr));
    return 0;
  }

  total_counter = 0;
  if (data->graph->E < data->graph->V) {
    /*
     * if E - V + 1 < 1  <=> E - V < 0 <=> E < V
     *
     * graph is not connected and our heuristic for reservation
     * fails => allocate something ;)
     * */
    alloced = RDL_RESERVED_START;
  }
  else {
    alloced = data->graph->E - data->graph->V + 1;
  }
  result = malloc(alloced * sizeof(*result));

  /* calculate basis for each BCC (and therefore for each CC) */

  for (bcc_index = 0; bcc_index < data->bccGraphs->nof_bcc; ++bcc_index) {
    curr_graph = data->bccGraphs->bcc_graphs[bcc_index];

    size=curr_graph->E - curr_graph->V + 1;

    basisCycles = malloc(size * sizeof(*basisCycles));
    prototypesForGaussian =
        malloc(data->nofURFsPerBCC[bcc_index] * sizeof(*prototypesForGaussian));

    /* copy the prototypes for gaussian elimination */
    /*
     * it is sufficient to take the first prototype for each URF
     * (the other's are linearly dependent anyway
     */
    for (internal_index = 0;
        internal_index < data->nofURFsPerBCC[bcc_index]; ++internal_index) {
      compressedSize = RDL_bitset_compressed(&(prototypesForGaussian[internal_index]),
          data->urfInfoPerBCC[bcc_index]->URFs[internal_index][0]->prototype,
          curr_graph->E);
    }

    empty_cycle = malloc(compressedSize * sizeof(*empty_cycle));
    memset((unsigned char*)empty_cycle, 0, compressedSize * sizeof(*empty_cycle));

    added = 0;
    currentBasisCyclesSize = 0;

    for (internal_index = 0;
        internal_index < data->nofURFsPerBCC[bcc_index]; ++internal_index, ++urf) {

      currentCycle = malloc(compressedSize * sizeof(*currentCycle));
      memcpy(currentCycle, prototypesForGaussian[internal_index],
          compressedSize * sizeof(*currentCycle));

      /*
       * basisCycles is in row echelon form!result = realloc(result, nextfree * sizeof(*result));
       * [this corresponds to "add row operation"]
       */
      for (k = 0; k < currentBasisCyclesSize; ++k) {
        if (RDL_bitset_test(currentCycle, k)) {
          RDL_bitset_xor_inplace(currentCycle, basisCycles[k], compressedSize);
        }
      }

      if (RDL_bitset_empty(currentCycle, empty_cycle, compressedSize)) {
        free(currentCycle);
        continue;
      }
      /*
       * the current cycle is indepedent of equal and smaller
       * sized cycles => part of the basis
       */
      oldBasisCyclesSize = currentBasisCyclesSize;
      basisCycles[currentBasisCyclesSize] = currentCycle;
      ++currentBasisCyclesSize;

      /*
       * this is where the magic is happening: ensure that the basis is
       * indeed in row echelon form (we use the property throughout the algorithm)
       *
       * swap columns such that indeed the current ring with index currentBasisCycleSize-1
       * has a 1 at column currentBasisCycleSize-1
       * => ROW ECHELON FORM
       *
       * [this corresponds to the "swap columns operation" of gaussian elimination]
       */
      if (!RDL_bitset_test(currentCycle, oldBasisCyclesSize)) {
        for (k = oldBasisCyclesSize + 1; k < curr_graph->E; ++k) {
          if (RDL_bitset_test(currentCycle, k)) {
            RDL_swap_columns(basisCycles, currentBasisCyclesSize, oldBasisCyclesSize, k);
            RDL_swap_columns(prototypesForGaussian, data->nofURFsPerBCC[bcc_index], oldBasisCyclesSize, k);
            break;
          }
        }
      }

      prototype = data->urfInfoPerBCC[bcc_index]->URFs[internal_index][0]->prototype;

      /* can happen for unconnected graphs */
      if (total_counter >= alloced) {
        alloced *= 2;
        result = realloc(result, (alloced) * sizeof(*result));
      }

      currBond = 0;
      result[total_counter] = malloc(sizeof(**result));
      result[total_counter]->edges = malloc(data->urfInfoPerBCC[bcc_index]->URFs[internal_index][0]->weight *
                                   sizeof(*(result[total_counter]->edges)));
      result[total_counter]->weight = data->urfInfoPerBCC[bcc_index]->URFs[internal_index][0]->weight;
      result[total_counter]->urf = urf;
      result[total_counter]->rcf = rcf;
      for(j=0; j < curr_graph->E; ++j) {
        if(prototype[j] == 1) {
          edge = data->bccGraphs->edge_from_bcc_mapping[bcc_index][j];
          result[total_counter]->edges[currBond][0] = data->graph->edges[edge][0];
          result[total_counter]->edges[currBond][1] = data->graph->edges[edge][1];
          ++currBond;
        }
      }

      rcf += data->urfInfoPerBCC[bcc_index]->nofCFsPerURF[internal_index];

      /*if enough inRDL_dependent cycles were found, break out of the loop*/
      ++total_counter;
      if(++added == size) {
        break;
      }
    }

    for (k = 0; k < currentBasisCyclesSize; ++k) {
      free(basisCycles[k]);
    }
    free(basisCycles);

    for (k = 0; k < data->nofURFsPerBCC[bcc_index]; ++k) {
      free(prototypesForGaussian[k]);
    }
    free(prototypesForGaussian);
    free((void*)empty_cycle);
  }

  result = realloc(result, total_counter * sizeof(*result));

  (*ptr) = result;
  return total_counter;
}